

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall
helics::CoreBroker::findAndNotifyInputTargets
          (CoreBroker *this,BasicHandleInfo *handleInfo,string *key)

{
  UnknownHandleManager *this_00;
  BasicHandleInfo *pBVar1;
  pair<helics::GlobalHandle,_unsigned_short> *target;
  pointer ppVar2;
  pointer ppVar3;
  vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  Handles;
  undefined1 local_e0 [16];
  _Alloc_hider local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  string local_b0;
  string local_90;
  string *local_70;
  string *local_68;
  pointer local_60;
  pointer ppStack_58;
  pointer local_50;
  _Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  local_48;
  
  this_00 = &this->unknownHandles;
  UnknownHandleManager::checkForInputs
            ((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
              *)&local_48,this_00,(string *)key);
  ppVar3 = local_48._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar2 = local_48._M_impl.super__Vector_impl_data._M_start; ppVar2 != ppVar3;
      ppVar2 = ppVar2 + 1) {
    pBVar1 = HandleManager::findHandle(&this->handles,ppVar2->first);
    if (pBVar1 == (BasicHandleInfo *)0x0) {
      local_e0._0_8_ = ppVar2->first;
      local_e0._8_8_ = (pointer)0x7088ca6c00;
      local_d0._M_p = (pointer)&local_c0;
      local_c8 = 0;
      local_c0._M_local_buf[0] = '\0';
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_local_buf[0] = '\0';
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      local_90._M_string_length = 0;
      local_90.field_2._M_local_buf[0] = '\0';
      local_70 = &local_b0;
      local_68 = &local_90;
      local_60 = (pointer)0x0;
      ppStack_58 = (pointer)0x0;
      local_50 = (pointer)0x0;
      connectInterfaces(this,handleInfo,(uint)handleInfo->flags,(BasicHandleInfo *)local_e0,
                        (uint)ppVar2->second,
                        (pair<helics::action_message_def::action_t,_helics::action_message_def::action_t>
                         )0x3200000046);
      BasicHandleInfo::~BasicHandleInfo((BasicHandleInfo *)local_e0);
    }
    else {
      connectInterfaces(this,handleInfo,(uint)handleInfo->flags,pBVar1,(uint)ppVar2->second,
                        (pair<helics::action_message_def::action_t,_helics::action_message_def::action_t>
                         )0x3200000046);
    }
  }
  if (local_48._M_impl.super__Vector_impl_data._M_start !=
      local_48._M_impl.super__Vector_impl_data._M_finish) {
    UnknownHandleManager::clearInput(this_00,(string *)key);
  }
  if ((this->super_BrokerBase).brokerState._M_i == OPERATING) {
    UnknownHandleManager::checkForReconnectionInputs
              ((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                *)local_e0,this_00,(string *)key);
    CLI::std::
    vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ::_M_move_assign((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                      *)&local_48,
                     (_Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                      *)local_e0);
    CLI::std::
    _Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ::~_Vector_base((_Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                     *)local_e0);
    for (ppVar3 = local_48._M_impl.super__Vector_impl_data._M_start;
        ppVar3 != local_48._M_impl.super__Vector_impl_data._M_finish; ppVar3 = ppVar3 + 1) {
      pBVar1 = HandleManager::findHandle(&this->handles,ppVar3->first);
      if (pBVar1 == (BasicHandleInfo *)0x0) {
        local_e0._0_8_ = ppVar3->first;
        local_e0._8_8_ = (pointer)0x7088ca6c00;
        local_d0._M_p = (pointer)&local_c0;
        local_c8 = 0;
        local_c0._M_local_buf[0] = '\0';
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        local_b0._M_string_length = 0;
        local_b0.field_2._M_local_buf[0] = '\0';
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        local_90._M_string_length = 0;
        local_90.field_2._M_local_buf[0] = '\0';
        local_70 = &local_b0;
        local_68 = &local_90;
        local_60 = (pointer)0x0;
        ppStack_58 = (pointer)0x0;
        local_50 = (pointer)0x0;
        connectInterfaces(this,handleInfo,(uint)handleInfo->flags,(BasicHandleInfo *)local_e0,
                          (uint)ppVar3->second,
                          (pair<helics::action_message_def::action_t,_helics::action_message_def::action_t>
                           )0x3200000046);
        BasicHandleInfo::~BasicHandleInfo((BasicHandleInfo *)local_e0);
      }
      else {
        connectInterfaces(this,handleInfo,(uint)handleInfo->flags,pBVar1,(uint)ppVar3->second,
                          (pair<helics::action_message_def::action_t,_helics::action_message_def::action_t>
                           )0x3200000046);
      }
    }
  }
  CLI::std::
  _Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  ::~_Vector_base(&local_48);
  return;
}

Assistant:

void CoreBroker::findAndNotifyInputTargets(BasicHandleInfo& handleInfo, const std::string& key)
{
    auto Handles = unknownHandles.checkForInputs(key);
    for (auto& target : Handles) {
        auto* pub = handles.findHandle(target.first);
        if (pub == nullptr) {
            connectInterfaces(handleInfo,
                              handleInfo.flags,
                              BasicHandleInfo(target.first.fed_id,
                                              target.first.handle,
                                              InterfaceType::PUBLICATION),

                              target.second,
                              std::make_pair(CMD_ADD_SUBSCRIBER, CMD_ADD_PUBLISHER));
        } else {
            connectInterfaces(handleInfo,
                              handleInfo.flags,
                              *pub,

                              target.second,
                              std::make_pair(CMD_ADD_SUBSCRIBER, CMD_ADD_PUBLISHER));
        }
    }
    if (!Handles.empty()) {
        unknownHandles.clearInput(key);
    }
    if (getBrokerState() == BrokerState::OPERATING) {
        Handles = unknownHandles.checkForReconnectionInputs(key);
        for (auto& target : Handles) {
            auto* pub = handles.findHandle(target.first);
            if (pub == nullptr) {
                connectInterfaces(handleInfo,
                                  handleInfo.flags,
                                  BasicHandleInfo(target.first.fed_id,
                                                  target.first.handle,
                                                  InterfaceType::PUBLICATION),

                                  target.second,
                                  std::make_pair(CMD_ADD_SUBSCRIBER, CMD_ADD_PUBLISHER));
            } else {
                connectInterfaces(handleInfo,
                                  handleInfo.flags,
                                  *pub,

                                  target.second,
                                  std::make_pair(CMD_ADD_SUBSCRIBER, CMD_ADD_PUBLISHER));
            }
        }
    }
}